

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMLexer.cpp
# Opt level: O2

Token __thiscall cmm::CMMLexer::LexString(CMMLexer *this)

{
  LocTy ErrorLoc;
  bool bVar1;
  int iVar2;
  int local_94;
  string *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->StrVal)._M_string_length = 0;
  local_90 = &this->StrVal;
  *(this->StrVal)._M_dataplus._M_p = '\0';
  do {
    iVar2 = getNextChar(this);
    if (iVar2 == 0x5c) {
      ErrorLoc = this->SrcMgr->CurrentLoc;
      local_94 = getNextChar(this);
      if (local_94 == -1) {
        std::__cxx11::string::string
                  ((string *)&local_88,"end of file in string constant after \\",
                   (allocator *)&local_48);
        Error(this,&local_88);
        goto LAB_00106091;
      }
      bVar1 = UnEscapeChar(&local_94);
      if (bVar1) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
        std::operator+(&local_48,"\\",&local_68);
        std::operator+(&local_88,&local_48," is an invalid escaping sequence in string literal");
        Warning(this,ErrorLoc,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::push_back((char)local_90);
      }
    }
    else {
      if (iVar2 == 0x22) {
        return (Token)String;
      }
      if (iVar2 == -1) {
        std::__cxx11::string::string
                  ((string *)&local_88,"end of file in string constant",(allocator *)&local_48);
        Error(this,&local_88);
LAB_00106091:
        std::__cxx11::string::~string((string *)&local_88);
        return (Token)Error;
      }
    }
    std::__cxx11::string::push_back((char)local_90);
  } while( true );
}

Assistant:

Token CMMLexer::LexString() {
  StrVal.clear();
  for (;;) {
    int CurChar = getNextChar();

    if (CurChar == '"') {
      // UnEscapeLexed(StrVal);
      return Token::String;
    }

    if (CurChar == std::char_traits<char>::eof()) {
      Error("end of file in string constant");
      return Token::Error;
    }

    if (CurChar == '\\') {
      LocTy Loc = SrcMgr.getLoc();

      CurChar = getNextChar();

      if (CurChar == std::char_traits<char>::eof()) {
        Error("end of file in string constant after \\");
        return Token::Error;
      }

      if (UnEscapeChar(CurChar)) {
        Warning(Loc, "\\" + std::string(1, static_cast<char>(CurChar)) +
            " is an invalid escaping sequence in string literal");
        StrVal.push_back('\\');
      }
    }
    StrVal.push_back(static_cast<char>(CurChar));
  }
}